

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::json_string_to_utf8(utf8 *this,string *src)

{
  size_type sVar1;
  char c;
  string *dst;
  ulong uVar2;
  size_t sVar3;
  json_utf8_exception *this_00;
  size_t dst_index;
  ulong local_38;
  
  dst_index = 0;
  dst = (string *)operator_new(0x20);
  sVar1 = src->_M_string_length;
  (dst->_M_dataplus)._M_p = (pointer)&dst->field_2;
  std::__cxx11::string::_M_construct((ulong)dst,(char)sVar1);
  *(string **)this = dst;
  uVar2 = 0;
LAB_0011ae7b:
  do {
    if (src->_M_string_length <= uVar2) {
      std::__cxx11::string::resize((ulong)dst);
      return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )this;
    }
    c = (src->_M_dataplus)._M_p[uVar2];
    local_38 = uVar2 + 1;
    if (c != '\\') {
LAB_0011aee6:
      sVar3 = dst_index;
      dst_index = dst_index + 1;
      goto LAB_0011aef4;
    }
    c = next_char(src,&local_38);
    sVar3 = dst_index;
    switch(c) {
    case 'n':
      c = '\n';
      dst_index = dst_index + 1;
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_0011af0d_caseD_6f:
      this_00 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this_00,invalid_string_escape_e,c);
      __cxa_throw(this_00,&json_utf8_exception::typeinfo,std::exception::~exception);
    case 'r':
      c = '\r';
      dst_index = dst_index + 1;
      break;
    case 't':
      c = '\t';
      dst_index = dst_index + 1;
      break;
    case 'u':
      goto switchD_0011af0d_caseD_75;
    default:
      if (((c == '\"') || (c == '/')) || (c == '\\')) goto LAB_0011aee6;
      if (c == 'b') {
        c = '\b';
        dst_index = dst_index + 1;
      }
      else {
        if (c != 'f') goto switchD_0011af0d_caseD_6f;
        c = '\f';
        dst_index = dst_index + 1;
      }
    }
LAB_0011aef4:
    (dst->_M_dataplus)._M_p[sVar3] = c;
    uVar2 = local_38;
  } while( true );
switchD_0011af0d_caseD_75:
  parse_unicode(src,&local_38,dst,&dst_index);
  uVar2 = local_38;
  goto LAB_0011ae7b;
}

Assistant:

unique_ptr<string> utf8::json_string_to_utf8(const string &src)
{
    size_t src_index = 0;
    size_t dst_index = 0;

    string *dst = new string(src.size(), '\0');

    unique_ptr<string> res(dst);

    while (src_index < src.size())
    {
        if (src[src_index] != '\\')
        {
            (*dst)[dst_index++] = src[src_index++];
        }
        else
        {
            char c = next_char(src, ++src_index);

            switch (c)
            {
            case '"':
            case '\\':
            case '/':
                (*dst)[dst_index++] = c;
                break;
            case 'b':
                (*dst)[dst_index++] = '\b';
                break;
            case 'f':
                (*dst)[dst_index++] = '\f';
                break;
            case 'n':
                (*dst)[dst_index++] = '\n';
                break;
            case 'r':
                (*dst)[dst_index++] = '\r';
                break;
            case 't':
                (*dst)[dst_index++] = '\t';
                break;
            case 'u':
                parse_unicode(src, src_index, *dst, dst_index);
                break;
            default: 
                throw json_utf8_exception(json_utf8_exception::invalid_string_escape_e, c);
            }
        }
    }

    dst->resize(dst_index);
    return res;
}